

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convert_functional.h
# Opt level: O3

void __thiscall
mp::
BasicFCC<mp::FCC<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::MaxId>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mp::CustomFunctionalConstraint<std::array<int,_1UL>,_mp::PLConParams,_mp::NumericFunctionalConstraintTraits,_mp::PLId>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::MaxId>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mp::CustomFunctionalConstraint<std::array<int,_1UL>,_mp::PLConParams,_mp::NumericFunctionalConstraintTraits,_mp::PLId>_>
::AddConstraint(BasicFCC<mp::FCC<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::MaxId>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mp::CustomFunctionalConstraint<std::array<int,_1UL>,_mp::PLConParams,_mp::NumericFunctionalConstraintTraits,_mp::PLId>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::MaxId>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mp::CustomFunctionalConstraint<std::array<int,_1UL>,_mp::PLConParams,_mp::NumericFunctionalConstraintTraits,_mp::PLId>_>
                *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  FlatConverter<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::MaxId>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::MaxId>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>
  *this_00;
  NodeRange nr;
  CustomFunctionalConstraint<std::array<int,_1UL>,_mp::PLConParams,_mp::NumericFunctionalConstraintTraits,_mp::PLId>
  local_b8;
  
  this_00 = &this->converter_->
             super_FlatConverter<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::MaxId>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::MaxId>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>
  ;
  paVar2 = &local_b8.super_FunctionalConstraint.super_BasicConstraint.name_.field_2;
  local_b8.super_FunctionalConstraint.super_BasicConstraint.name_._M_dataplus._M_p =
       (this->constr_).super_FunctionalConstraint.super_BasicConstraint.name_._M_dataplus._M_p;
  paVar1 = &(this->constr_).super_FunctionalConstraint.super_BasicConstraint.name_.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8.super_FunctionalConstraint.super_BasicConstraint.name_._M_dataplus._M_p == paVar1)
  {
    local_b8.super_FunctionalConstraint.super_BasicConstraint.name_.field_2._M_allocated_capacity =
         paVar1->_M_allocated_capacity;
    local_b8.super_FunctionalConstraint.super_BasicConstraint.name_.field_2._8_8_ =
         *(undefined8 *)
          ((long)&(this->constr_).super_FunctionalConstraint.super_BasicConstraint.name_.field_2 + 8
          );
    local_b8.super_FunctionalConstraint.super_BasicConstraint.name_._M_dataplus._M_p =
         (pointer)paVar2;
  }
  else {
    local_b8.super_FunctionalConstraint.super_BasicConstraint.name_.field_2._M_allocated_capacity =
         paVar1->_M_allocated_capacity;
  }
  local_b8.super_FunctionalConstraint.super_BasicConstraint.name_._M_string_length =
       (this->constr_).super_FunctionalConstraint.super_BasicConstraint.name_._M_string_length;
  (this->constr_).super_FunctionalConstraint.super_BasicConstraint.name_._M_dataplus._M_p =
       (pointer)paVar1;
  (this->constr_).super_FunctionalConstraint.super_BasicConstraint.name_._M_string_length = 0;
  (this->constr_).super_FunctionalConstraint.super_BasicConstraint.name_.field_2._M_local_buf[0] =
       '\0';
  local_b8.super_FunctionalConstraint.result_var_ =
       (this->constr_).super_FunctionalConstraint.result_var_;
  local_b8.super_FunctionalConstraint.ctx.value_ =
       (this->constr_).super_FunctionalConstraint.ctx.value_;
  local_b8.super_CustomConstraintData<std::array<int,_1UL>,_mp::PLConParams,_mp::PLId>.args_.
  _M_elems[0] = (_Type)(this->constr_).
                       super_CustomConstraintData<std::array<int,_1UL>,_mp::PLConParams,_mp::PLId>.
                       args_._M_elems[0];
  local_b8.super_CustomConstraintData<std::array<int,_1UL>,_mp::PLConParams,_mp::PLId>.params_.pls_.
  breakpoints_.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (this->constr_).
             super_CustomConstraintData<std::array<int,_1UL>,_mp::PLConParams,_mp::PLId>.params_.
             pls_.breakpoints_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
  local_b8.super_CustomConstraintData<std::array<int,_1UL>,_mp::PLConParams,_mp::PLId>.params_.pls_.
  breakpoints_.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = *(pointer *)
               ((long)&(this->constr_).
                       super_CustomConstraintData<std::array<int,_1UL>,_mp::PLConParams,_mp::PLId>.
                       params_.pls_.breakpoints_.super__Vector_base<double,_std::allocator<double>_>
                       ._M_impl + 8);
  local_b8.super_CustomConstraintData<std::array<int,_1UL>,_mp::PLConParams,_mp::PLId>.params_.pls_.
  breakpoints_.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage =
       *(pointer *)
        ((long)&(this->constr_).
                super_CustomConstraintData<std::array<int,_1UL>,_mp::PLConParams,_mp::PLId>.params_.
                pls_.breakpoints_.super__Vector_base<double,_std::allocator<double>_>._M_impl + 0x10
        );
  *(pointer *)
   ((long)&(this->constr_).
           super_CustomConstraintData<std::array<int,_1UL>,_mp::PLConParams,_mp::PLId>.params_.pls_.
           breakpoints_.super__Vector_base<double,_std::allocator<double>_>._M_impl + 0x10) =
       (pointer)0x0;
  (this->constr_).super_CustomConstraintData<std::array<int,_1UL>,_mp::PLConParams,_mp::PLId>.
  params_.pls_.breakpoints_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  *(pointer *)
   ((long)&(this->constr_).
           super_CustomConstraintData<std::array<int,_1UL>,_mp::PLConParams,_mp::PLId>.params_.pls_.
           breakpoints_.super__Vector_base<double,_std::allocator<double>_>._M_impl + 8) =
       (pointer)0x0;
  local_b8.super_CustomConstraintData<std::array<int,_1UL>,_mp::PLConParams,_mp::PLId>.params_.pls_.
  slopes_.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (this->constr_).
             super_CustomConstraintData<std::array<int,_1UL>,_mp::PLConParams,_mp::PLId>.params_.
             pls_.slopes_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
  local_b8.super_CustomConstraintData<std::array<int,_1UL>,_mp::PLConParams,_mp::PLId>.params_.pls_.
  slopes_.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = *(pointer *)
               ((long)&(this->constr_).
                       super_CustomConstraintData<std::array<int,_1UL>,_mp::PLConParams,_mp::PLId>.
                       params_.pls_.slopes_.super__Vector_base<double,_std::allocator<double>_>.
                       _M_impl + 8);
  local_b8.super_CustomConstraintData<std::array<int,_1UL>,_mp::PLConParams,_mp::PLId>.params_.pls_.
  slopes_.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage =
       *(pointer *)
        ((long)&(this->constr_).
                super_CustomConstraintData<std::array<int,_1UL>,_mp::PLConParams,_mp::PLId>.params_.
                pls_.slopes_.super__Vector_base<double,_std::allocator<double>_>._M_impl + 0x10);
  *(pointer *)
   ((long)&(this->constr_).
           super_CustomConstraintData<std::array<int,_1UL>,_mp::PLConParams,_mp::PLId>.params_.pls_.
           slopes_.super__Vector_base<double,_std::allocator<double>_>._M_impl + 0x10) =
       (pointer)0x0;
  (this->constr_).super_CustomConstraintData<std::array<int,_1UL>,_mp::PLConParams,_mp::PLId>.
  params_.pls_.slopes_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  *(pointer *)
   ((long)&(this->constr_).
           super_CustomConstraintData<std::array<int,_1UL>,_mp::PLConParams,_mp::PLId>.params_.pls_.
           slopes_.super__Vector_base<double,_std::allocator<double>_>._M_impl + 8) = (pointer)0x0;
  local_b8.super_CustomConstraintData<std::array<int,_1UL>,_mp::PLConParams,_mp::PLId>.params_.pls_.
  X0_ = (this->constr_).super_CustomConstraintData<std::array<int,_1UL>,_mp::PLConParams,_mp::PLId>.
        params_.pls_.X0_;
  local_b8.super_CustomConstraintData<std::array<int,_1UL>,_mp::PLConParams,_mp::PLId>.params_.pls_.
  Y0_ = (this->constr_).super_CustomConstraintData<std::array<int,_1UL>,_mp::PLConParams,_mp::PLId>.
        params_.pls_.Y0_;
  local_b8.super_CustomConstraintData<std::array<int,_1UL>,_mp::PLConParams,_mp::PLId>.params_.plp_.
  x_.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start =
       (this->constr_).super_CustomConstraintData<std::array<int,_1UL>,_mp::PLConParams,_mp::PLId>.
       params_.plp_.x_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
       super__Vector_impl_data._M_start;
  local_b8.super_CustomConstraintData<std::array<int,_1UL>,_mp::PLConParams,_mp::PLId>.params_.plp_.
  x_.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_finish =
       *(pointer *)
        ((long)&(this->constr_).
                super_CustomConstraintData<std::array<int,_1UL>,_mp::PLConParams,_mp::PLId>.params_.
                plp_.x_.super__Vector_base<double,_std::allocator<double>_>._M_impl + 8);
  local_b8.super_CustomConstraintData<std::array<int,_1UL>,_mp::PLConParams,_mp::PLId>.params_.plp_.
  x_.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage =
       *(pointer *)
        ((long)&(this->constr_).
                super_CustomConstraintData<std::array<int,_1UL>,_mp::PLConParams,_mp::PLId>.params_.
                plp_.x_.super__Vector_base<double,_std::allocator<double>_>._M_impl + 0x10);
  *(pointer *)
   ((long)&(this->constr_).
           super_CustomConstraintData<std::array<int,_1UL>,_mp::PLConParams,_mp::PLId>.params_.plp_.
           x_.super__Vector_base<double,_std::allocator<double>_>._M_impl + 0x10) = (pointer)0x0;
  (this->constr_).super_CustomConstraintData<std::array<int,_1UL>,_mp::PLConParams,_mp::PLId>.
  params_.plp_.x_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  *(pointer *)
   ((long)&(this->constr_).
           super_CustomConstraintData<std::array<int,_1UL>,_mp::PLConParams,_mp::PLId>.params_.plp_.
           x_.super__Vector_base<double,_std::allocator<double>_>._M_impl + 8) = (pointer)0x0;
  local_b8.super_CustomConstraintData<std::array<int,_1UL>,_mp::PLConParams,_mp::PLId>.params_.plp_.
  y_.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start =
       (this->constr_).super_CustomConstraintData<std::array<int,_1UL>,_mp::PLConParams,_mp::PLId>.
       params_.plp_.y_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
       super__Vector_impl_data._M_start;
  local_b8.super_CustomConstraintData<std::array<int,_1UL>,_mp::PLConParams,_mp::PLId>.params_.plp_.
  y_.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_finish =
       *(pointer *)
        ((long)&(this->constr_).
                super_CustomConstraintData<std::array<int,_1UL>,_mp::PLConParams,_mp::PLId>.params_.
                plp_.y_.super__Vector_base<double,_std::allocator<double>_>._M_impl + 8);
  local_b8.super_CustomConstraintData<std::array<int,_1UL>,_mp::PLConParams,_mp::PLId>.params_.plp_.
  y_.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage =
       *(pointer *)
        ((long)&(this->constr_).
                super_CustomConstraintData<std::array<int,_1UL>,_mp::PLConParams,_mp::PLId>.params_.
                plp_.y_.super__Vector_base<double,_std::allocator<double>_>._M_impl + 0x10);
  *(pointer *)
   ((long)&(this->constr_).
           super_CustomConstraintData<std::array<int,_1UL>,_mp::PLConParams,_mp::PLId>.params_.plp_.
           y_.super__Vector_base<double,_std::allocator<double>_>._M_impl + 0x10) = (pointer)0x0;
  (this->constr_).super_CustomConstraintData<std::array<int,_1UL>,_mp::PLConParams,_mp::PLId>.
  params_.plp_.y_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  *(pointer *)
   ((long)&(this->constr_).
           super_CustomConstraintData<std::array<int,_1UL>,_mp::PLConParams,_mp::PLId>.params_.plp_.
           y_.super__Vector_base<double,_std::allocator<double>_>._M_impl + 8) = (pointer)0x0;
  nr = FlatConverter<mp::FlatCvtImpl<mp::FlatConverter,TestBackendAcceptingConstraints<mp::CustomFunctionalConstraint<std::vector<int,std::allocator<int>>,std::array<int,0ul>,mp::NumericFunctionalConstraintTraits,mp::MaxId>>,mp::FlatModel<mp::DefaultFlatModelParams>>,TestBackendAcceptingConstraints<mp::CustomFunctionalConstraint<std::vector<int,std::allocator<int>>,std::array<int,0ul>,mp::NumericFunctionalConstraintTraits,mp::MaxId>>,mp::FlatModel<mp::DefaultFlatModelParams>>
       ::
       AddConstraintAndTryNoteResultVariable<mp::CustomFunctionalConstraint<std::array<int,1ul>,mp::PLConParams,mp::NumericFunctionalConstraintTraits,mp::PLId>>
                 ((FlatConverter<mp::FlatCvtImpl<mp::FlatConverter,TestBackendAcceptingConstraints<mp::CustomFunctionalConstraint<std::vector<int,std::allocator<int>>,std::array<int,0ul>,mp::NumericFunctionalConstraintTraits,mp::MaxId>>,mp::FlatModel<mp::DefaultFlatModelParams>>,TestBackendAcceptingConstraints<mp::CustomFunctionalConstraint<std::vector<int,std::allocator<int>>,std::array<int,0ul>,mp::NumericFunctionalConstraintTraits,mp::MaxId>>,mp::FlatModel<mp::DefaultFlatModelParams>>
                   *)this_00,&local_b8);
  FlatConverter<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::MaxId>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::MaxId>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>
  ::AutoLink(this_00,nr);
  if (local_b8.super_CustomConstraintData<std::array<int,_1UL>,_mp::PLConParams,_mp::PLId>.params_.
      plp_.y_.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_b8.
                    super_CustomConstraintData<std::array<int,_1UL>,_mp::PLConParams,_mp::PLId>.
                    params_.plp_.y_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_b8.
                          super_CustomConstraintData<std::array<int,_1UL>,_mp::PLConParams,_mp::PLId>
                          .params_.plp_.y_.super__Vector_base<double,_std::allocator<double>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_b8.
                          super_CustomConstraintData<std::array<int,_1UL>,_mp::PLConParams,_mp::PLId>
                          .params_.plp_.y_.super__Vector_base<double,_std::allocator<double>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_b8.super_CustomConstraintData<std::array<int,_1UL>,_mp::PLConParams,_mp::PLId>.params_.
      plp_.x_.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_b8.
                    super_CustomConstraintData<std::array<int,_1UL>,_mp::PLConParams,_mp::PLId>.
                    params_.plp_.x_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_b8.
                          super_CustomConstraintData<std::array<int,_1UL>,_mp::PLConParams,_mp::PLId>
                          .params_.plp_.x_.super__Vector_base<double,_std::allocator<double>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_b8.
                          super_CustomConstraintData<std::array<int,_1UL>,_mp::PLConParams,_mp::PLId>
                          .params_.plp_.x_.super__Vector_base<double,_std::allocator<double>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_b8.super_CustomConstraintData<std::array<int,_1UL>,_mp::PLConParams,_mp::PLId>.params_.
      pls_.slopes_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_b8.
                    super_CustomConstraintData<std::array<int,_1UL>,_mp::PLConParams,_mp::PLId>.
                    params_.pls_.slopes_.super__Vector_base<double,_std::allocator<double>_>._M_impl
                    .super__Vector_impl_data._M_start,
                    (long)local_b8.
                          super_CustomConstraintData<std::array<int,_1UL>,_mp::PLConParams,_mp::PLId>
                          .params_.pls_.slopes_.super__Vector_base<double,_std::allocator<double>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_b8.
                          super_CustomConstraintData<std::array<int,_1UL>,_mp::PLConParams,_mp::PLId>
                          .params_.pls_.slopes_.super__Vector_base<double,_std::allocator<double>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_b8.super_CustomConstraintData<std::array<int,_1UL>,_mp::PLConParams,_mp::PLId>.params_.
      pls_.breakpoints_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_b8.
                    super_CustomConstraintData<std::array<int,_1UL>,_mp::PLConParams,_mp::PLId>.
                    params_.pls_.breakpoints_.super__Vector_base<double,_std::allocator<double>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_b8.
                          super_CustomConstraintData<std::array<int,_1UL>,_mp::PLConParams,_mp::PLId>
                          .params_.pls_.breakpoints_.
                          super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_b8.
                          super_CustomConstraintData<std::array<int,_1UL>,_mp::PLConParams,_mp::PLId>
                          .params_.pls_.breakpoints_.
                          super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8.super_FunctionalConstraint.super_BasicConstraint.name_._M_dataplus._M_p != paVar2)
  {
    operator_delete(local_b8.super_FunctionalConstraint.super_BasicConstraint.name_._M_dataplus._M_p
                    ,local_b8.super_FunctionalConstraint.super_BasicConstraint.name_.field_2.
                     _M_allocated_capacity + 1);
  }
  FlatConverter<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::MaxId>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::MaxId>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>
  ::IncrementVarUsage(&this->converter_->
                       super_FlatConverter<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::MaxId>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::MaxId>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>
                      ,(this->prepro_).result_var_);
  return;
}

Assistant:

void AddConstraint() {
    GetConverter().AddConstraint( std::move(GetConstraint()) );
    GetConverter().IncrementVarUsage(GetResultVar());   // ater adding the con
  }